

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitcell.hpp
# Opt level: O0

unitcell * lattice::unitcell::simple(size_t dim)

{
  ulong in_RSI;
  unitcell *in_RDI;
  int unaff_retaddr;
  offset_t *in_stack_00000008;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  unitcell *in_stack_00000020;
  offset_t os;
  size_t m;
  unitcell *cell;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_ffffffffffffff68;
  unitcell *size;
  undefined8 local_58;
  int in_stack_ffffffffffffffd4;
  coordinate_t *in_stack_ffffffffffffffd8;
  unitcell *in_stack_ffffffffffffffe0;
  
  size = in_RDI;
  unitcell(in_RDI,(size_t)in_stack_ffffffffffffff68);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)size);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_RDI,in_stack_ffffffffffffff68);
  add_site(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1037ab);
  for (local_58 = 0; local_58 < in_RSI; local_58 = local_58 + 1) {
    Eigen::DenseBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::Zero((Index)size);
    Eigen::Matrix<long,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<long>,Eigen::Matrix<long,_1,1,0,_1,1>>>
              ((Matrix<long,__1,_1,_0,__1,_1> *)in_RDI,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<long>,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>_>
                *)in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff68 =
         (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *)Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *)in_RDI,
                       (Index)in_stack_ffffffffffffff68);
    *(Scalar *)in_stack_ffffffffffffff68 = 1;
    add_bond(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
    Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x103830);
  }
  return size;
}

Assistant:

static unitcell simple(std::size_t dim) {
    unitcell cell(dim);
    cell.add_site(coordinate_t::Zero(dim), 0);
    for (std::size_t m = 0; m < dim; ++m) {
      offset_t os = offset_t::Zero(dim);
      os(m) = 1;
      cell.add_bond(0, 0, os, 0);
    }
    return cell;
  }